

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O1

smf_event_t * smf_get_next_event(smf_t *smf)

{
  smf_track_t *track;
  smf_event_t *psVar1;
  
  track = smf_find_track_with_next_event(smf);
  if (track == (smf_track_t *)0x0) {
    psVar1 = (smf_event_t *)0x0;
  }
  else {
    psVar1 = smf_track_get_next_event(track);
    if (psVar1 == (smf_event_t *)0x0) {
      __assert_fail("event != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x34d,"smf_event_t *smf_get_next_event(smf_t *)");
    }
    psVar1->track->smf->last_seek_position = -1.0;
  }
  return psVar1;
}

Assistant:

smf_event_t *
smf_get_next_event(smf_t *smf)
{
	smf_event_t *event;
	smf_track_t *track = smf_find_track_with_next_event(smf);

	if (track == NULL) {
#if 0
		g_debug("End of the song.");
#endif

		return (NULL);
	}

	event = smf_track_get_next_event(track);
	
	assert(event != NULL);

	event->track->smf->last_seek_position = -1.0;

	return (event);
}